

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O0

void __thiscall minihttp::SocketSet::deleteAll(SocketSet *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  SocketSet *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<minihttp::TcpSocket_*,_minihttp::SocketSet::SocketSetData,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
       ::begin(&this->_store);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<minihttp::TcpSocket_*,_minihttp::SocketSet::SocketSetData,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
         ::end(&this->_store);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>
             ::operator->(&local_18);
    if (ppVar2->first != (TcpSocket *)0x0) {
      (*ppVar2->first->_vptr_TcpSocket[1])();
    }
    std::
    _Rb_tree_iterator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>::
    operator++(&local_18);
  }
  std::
  map<minihttp::TcpSocket_*,_minihttp::SocketSet::SocketSetData,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
  ::clear(&this->_store);
  return;
}

Assistant:

void SocketSet::deleteAll(void)
{
    for(Store::iterator it = _store.begin(); it != _store.end(); ++it)
        delete it->first;
    _store.clear();
}